

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

bool __thiscall libcellml::Variable::doEquals(Variable *this,EntityPtr *other)

{
  bool bVar1;
  __type _Var2;
  element_type *peVar3;
  VariableImpl *pVVar4;
  element_type *this_00;
  __type local_d1;
  undefined1 local_c8 [24];
  Variable local_b0;
  byte local_89;
  string local_88;
  byte local_61;
  string local_60;
  undefined1 local_30 [8];
  shared_ptr<libcellml::Variable> variable;
  EntityPtr *other_local;
  Variable *this_local;
  
  variable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)other;
  bVar1 = NamedEntity::doEquals(&this->super_NamedEntity,other);
  if (bVar1) {
    std::dynamic_pointer_cast<libcellml::Variable,libcellml::Entity>
              ((shared_ptr<libcellml::Entity> *)local_30);
    bVar1 = std::operator!=((shared_ptr<libcellml::Variable> *)local_30,(nullptr_t)0x0);
    local_61 = 0;
    local_89 = 0;
    local_d1 = false;
    if (bVar1) {
      pVVar4 = pFunc(this);
      peVar3 = std::
               __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
      initialValue_abi_cxx11_(&local_60,peVar3);
      local_61 = 1;
      _Var2 = std::operator==(&pVVar4->mInitialValue,&local_60);
      local_d1 = false;
      if (_Var2) {
        pVVar4 = pFunc(this);
        peVar3 = std::
                 __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_30);
        interfaceType_abi_cxx11_(&local_88,peVar3);
        local_89 = 1;
        local_d1 = std::operator==(&pVVar4->mInterfaceType,&local_88);
      }
    }
    if ((local_89 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_88);
    }
    if ((local_61 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_60);
    }
    if (local_d1 == false) {
      local_c8._20_4_ = 0;
    }
    else {
      pVVar4 = pFunc(this);
      bVar1 = std::operator!=(&pVVar4->mUnits,(nullptr_t)0x0);
      if (bVar1) {
        pVVar4 = pFunc(this);
        this_00 = std::
                  __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&pVVar4->mUnits);
        std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)local_30);
        units((Variable *)(local_c8 + 0x18));
        std::shared_ptr<libcellml::Entity>::shared_ptr<libcellml::Units,void>
                  ((shared_ptr<libcellml::Entity> *)
                   &local_b0.super_enable_shared_from_this<libcellml::Variable>,
                   (shared_ptr<libcellml::Units> *)(local_c8 + 0x18));
        this_local._7_1_ =
             Entity::equals((Entity *)this_00,
                            (EntityPtr *)
                            &local_b0.super_enable_shared_from_this<libcellml::Variable>);
        std::shared_ptr<libcellml::Entity>::~shared_ptr
                  ((shared_ptr<libcellml::Entity> *)
                   &local_b0.super_enable_shared_from_this<libcellml::Variable>);
        std::shared_ptr<libcellml::Units>::~shared_ptr
                  ((shared_ptr<libcellml::Units> *)(local_c8 + 0x18));
        local_c8._20_4_ = 1;
      }
      else {
        std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)local_30);
        units((Variable *)local_c8);
        this_local._7_1_ = std::operator==((shared_ptr<libcellml::Units> *)local_c8,(nullptr_t)0x0);
        std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_c8);
        local_c8._20_4_ = 1;
      }
    }
    std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_30);
    if (local_c8._20_4_ != 0) goto LAB_0039def2;
  }
  this_local._7_1_ = 0;
LAB_0039def2:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Variable::doEquals(const EntityPtr &other) const
{
    if (NamedEntity::doEquals(other)) {
        auto variable = std::dynamic_pointer_cast<libcellml::Variable>(other);
        if ((variable != nullptr)
            && pFunc()->mInitialValue == variable->initialValue()
            && pFunc()->mInterfaceType == variable->interfaceType()) {
            if (pFunc()->mUnits != nullptr) {
                return pFunc()->mUnits->equals(variable->units());
            }

            return variable->units() == nullptr;
        }
    }
    return false;
}